

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.h
# Opt level: O0

Own<kj::(anonymous_namespace)::InMemoryDirectory> __thiscall
kj::atomicRefcounted<kj::(anonymous_namespace)::InMemoryDirectory,kj::Clock_const&>
          (kj *this,Clock *params)

{
  InMemoryDirectory *this_00;
  Clock *clock;
  Own<kj::(anonymous_namespace)::InMemoryDirectory> OVar1;
  Clock *params_local;
  
  this_00 = (InMemoryDirectory *)operator_new(0x70);
  clock = fwd<kj::Clock_const&>(params);
  anon_unknown_35::InMemoryDirectory::InMemoryDirectory(this_00,clock);
  OVar1 = AtomicRefcounted::addRefInternal<kj::(anonymous_namespace)::InMemoryDirectory>
                    ((AtomicRefcounted *)this,this_00);
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

inline kj::Own<T> atomicRefcounted(Params&&... params) {
  return AtomicRefcounted::addRefInternal(new T(kj::fwd<Params>(params)...));
}